

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O3

void ansv<unsigned_long,0,1,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  pair<unsigned_long,_unsigned_long> *ppVar5;
  pair<unsigned_long,_unsigned_long> *ppVar6;
  unsigned_long *puVar7;
  _Elt_pointer ppVar8;
  comm *comm_00;
  _Map_pointer pppVar9;
  _Map_pointer pppVar10;
  comm *comm_01;
  unsigned_long uVar11;
  _Elt_pointer ppVar12;
  _Elt_pointer ppVar13;
  _Elt_pointer ppVar14;
  _Map_pointer pppVar15;
  _Map_pointer pppVar16;
  ulong uVar17;
  pointer puVar18;
  long lVar19;
  unsigned_long uVar20;
  unsigned_long uVar21;
  unsigned_long uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong *puVar29;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar30;
  bool bVar31;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1e8;
  _Elt_pointer local_190;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_188;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_178;
  _Map_pointer local_160;
  size_t local_158;
  pair<unsigned_long,_unsigned_long> local_150;
  ulong local_140;
  comm *local_138;
  _Elt_pointer ppStack_130;
  _Elt_pointer local_128;
  _Elt_pointer ppStack_120;
  _Elt_pointer local_118;
  _Elt_pointer ppStack_110;
  size_type local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Map_pointer local_80;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_188 = right_nsv;
  local_180 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1e8,0);
  local_100 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_138 = comm;
  uVar11 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_100,comm);
  lVar27 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar27 != 0) {
    lVar27 = lVar27 >> 3;
    do {
      ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar28 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar27 + -1];
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14) {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <= uVar28
               ) break;
            operator_delete(ppVar14);
            ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14 + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14 + 0x1f;
            ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar14;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar28)
            break;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar13);
        ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar13) {
          do {
            uVar20 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start[lVar27 + -1];
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14) {
              if (uVar20 != local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].
                            first) break;
              operator_delete(ppVar14);
              ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14 + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14 + 0x1f;
              ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar14;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              if (uVar20 != local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar13);
        }
      }
      local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((uVar11 - 1) + lVar27);
      local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar27 + -1];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_178);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
  }
  local_58.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_178,&local_58,&local_78,(allocator_type *)&local_98);
  pvVar3 = *(void **)local_180;
  *(pointer *)local_180 =
       local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_180 + 8) =
       local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_180 + 0x10) =
       local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158 = nonsv;
  if ((pvVar3 != (void *)0x0) &&
     (operator_delete(pvVar3),
     local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_190 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar28 = ((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x20;
  local_128 = (_Elt_pointer)left_nsv;
  local_118 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  pppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (uVar28 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 1, indexing_type = 0]"
                 );
  }
  for (; pppVar15 < pppVar10; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar9;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_118;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = local_190;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar17 = 0;
    do {
      ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar23 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar17];
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14) {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <= uVar23
               ) break;
            operator_delete(ppVar14);
            ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14 + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14 + 0x1f;
            ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar14;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar23)
            break;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar13);
        ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar13) {
          do {
            uVar20 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start[uVar17];
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14) {
              if (uVar20 != local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].
                            first) break;
              operator_delete(ppVar14);
              ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14 + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14 + 0x1f;
              ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar14;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              if (uVar20 != local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar13);
        }
      }
      local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar11 + uVar17);
      local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar17];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_178);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar17 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar31 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_190 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_160 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_80 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_180,*(undefined8 *)(local_180 + 8));
  pppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar27 = (long)ppVar14 - (long)local_190;
  local_190 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_140 = (local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar27 = (lVar27 >> 4) + ((long)ppVar13 - (long)ppVar12 >> 4) +
           (((uVar17 >> 3) - 1) + (ulong)bVar31) * 0x20;
  ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_110 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  comm_00 = local_138;
  if (lVar27 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 1, indexing_type = 0]"
                 );
  }
  for (; local_118 = ppVar14, local_138 = comm_00, pppVar15 < pppVar10; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
    ppVar14 = local_118;
    comm_00 = local_138;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar9;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_190;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_118;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_110;
  if (lVar27 + uVar28 != *(long *)(local_180 + 8) - *(long *)local_180 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 1, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_178,&local_140,1,comm_00);
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,(long)comm_00->m_size,(value_type_conflict *)&local_b0,
             (allocator_type *)&local_f8);
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,(long)comm_00->m_size,(value_type_conflict *)&local_f8,
             (allocator_type *)&local_c8);
  ppVar14 = local_128;
  comm_01 = local_138;
  pvVar30 = local_188;
  iVar1 = comm_00->m_rank;
  lVar27 = (long)iVar1;
  if (0 < lVar27) {
    uVar17 = *(ulong *)((long)local_178.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -8);
    local_190 = (_Elt_pointer)
                local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar26 = lVar27;
    uVar20 = 0;
    do {
      lVar19 = lVar26 + -1;
      uVar23 = uVar20 + 1;
      if (uVar20 + 1 < uVar28) {
        uVar23 = uVar28;
      }
      uVar4 = *(ulong *)((long)local_178.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -8);
      puVar29 = (ulong *)(uVar20 * 0x10 + *(long *)local_180);
      uVar21 = uVar20 - 1;
      do {
        uVar22 = uVar23 - 1;
        if ((1 - uVar23) + uVar21 == -1) break;
        uVar22 = uVar21 + 1;
        uVar25 = *puVar29;
        puVar29 = puVar29 + 2;
        uVar21 = uVar22;
      } while (uVar4 <= uVar25);
      if (uVar4 <= uVar17) {
        *(unsigned_long *)
         ((long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar19 * 8) = (uVar22 - uVar20) + 1;
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] = uVar20;
        uVar17 = uVar4;
        if (*(ulong *)((long)local_178.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar19 * 8) < local_140)
        break;
      }
      bVar31 = 1 < lVar26;
      lVar26 = lVar19;
      uVar20 = uVar22;
    } while (bVar31);
  }
  iVar2 = local_138->m_size;
  if (iVar1 < iVar2 + -1) {
    lVar26 = *(long *)local_180;
    uVar17 = ((unsigned_long *)
             ((long)local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar27];
    lVar27 = lVar27 + 1;
    uVar23 = (*(long *)(local_180 + 8) - lVar26 >> 4) - 1;
    do {
      uVar4 = local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar27];
      uVar25 = uVar23;
      if (uVar28 < uVar23) {
        puVar29 = (ulong *)(uVar23 * 0x10 + lVar26);
        uVar24 = uVar23;
        do {
          uVar25 = uVar24;
          if (*puVar29 < uVar4) break;
          uVar24 = uVar24 - 1;
          puVar29 = puVar29 + -2;
          uVar25 = uVar28;
        } while (uVar28 < uVar24);
      }
      if (uVar4 <= uVar17) {
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = (uVar23 - uVar25) + 1;
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = uVar25;
        uVar17 = uVar4;
        if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar27] < local_140) break;
      }
      lVar27 = lVar27 + 1;
      uVar23 = uVar25;
    } while (iVar2 != (int)lVar27);
  }
  mxx::all2all<unsigned_long>(&local_f8,&local_98,local_138);
  mxx::impl::get_displacements<unsigned_long>(&local_c8,&local_f8);
  local_118 = (_Elt_pointer)
              (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish[-1] +
              local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1]);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_e0,(size_type)local_118,(allocator_type *)&local_150);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_180,&local_98,&local_b0,
             local_e0.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_f8,&local_c8,comm_01);
  local_190 = (_Elt_pointer)
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_01->m_rank];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppVar14,local_100);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar30,local_100);
  pppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_138 = (comm *)local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_130 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  for (pppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node; pppVar15 < pppVar10;
      pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar13;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar9;
  lVar27 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)local_138;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_130;
  if (lVar27 != 0) {
    lVar27 = lVar27 >> 3;
    do {
      puVar18 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar20 = (uVar11 - 1) + lVar27;
      lVar27 = lVar27 + -1;
      ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar13) {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <=
                puVar18[lVar27]) break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar14->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar11] =
                 uVar20;
            operator_delete(ppVar13);
            ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar13 + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar13 + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar13;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <=
                puVar18[lVar27]) break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar14->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar11] = uVar20
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
        puVar18 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      local_150.first = puVar18[lVar27];
      local_150.second = uVar20;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_150);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_150.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar20;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar27 != 0);
  }
  ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_190 != (_Elt_pointer)0x0) {
    uVar28 = 0;
    local_138 = (comm *)((long)local_190 << 4);
    do {
      if (ppVar13 == ppVar12) break;
      puVar7 = &(local_e0.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first;
      ppVar8 = (_Elt_pointer)((long)local_138 + ~uVar28 * 0x10);
      uVar20 = *(unsigned_long *)
                ((long)&((_Elt_pointer)((long)local_138 + ~uVar28 * 0x10))->second + (long)puVar7);
      ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
      do {
        uVar17 = *(ulong *)((long)&ppVar8->first + (long)puVar7);
        if (ppVar13 == ppVar14) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <= uVar17)
          break;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128->first)->
          _M_impl).super__Vector_impl_data._M_start
          [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar11] =
               uVar20;
          operator_delete(ppVar14);
          ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar14 + 0x20;
          ppVar13 = ppVar14 + 0x1f;
          ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar14;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar13[-1].first <= uVar17) break;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar13[-1].second - uVar11] = uVar20;
          ppVar13 = ppVar13 + -1;
        }
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar13;
      } while (ppVar13 != ppVar12);
      uVar28 = uVar28 + 1;
      ppVar14 = local_128;
    } while ((_Elt_pointer)uVar28 != local_190);
  }
  pppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_128 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_120 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  pvVar30 = local_188;
  if (ppVar13 != ppVar12) {
    puVar18 = (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppVar14)->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    pppVar16 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    do {
      if (ppVar13 == ppVar14) {
        ppVar14 = pppVar16[-1];
        pppVar16 = pppVar16 + -1;
        puVar18[ppVar14[0x1f].second - uVar11] = local_158;
        ppVar13 = ppVar14 + 0x20;
      }
      else {
        puVar18[ppVar13[-1].second - uVar11] = local_158;
      }
      ppVar13 = ppVar13 + -1;
    } while (ppVar13 != ppVar12);
  }
  for (; local_188 = pvVar30, pppVar15 < pppVar10; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
    pvVar30 = local_188;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar9;
  puVar18 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_128;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_120;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar18) {
    uVar28 = 0;
    do {
      uVar20 = uVar28 + uVar11;
      ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar14) {
        uVar17 = puVar18[uVar28];
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar5 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          if (ppVar5[0x1f].first <= uVar17) {
            if (uVar17 == ppVar5[0x1f].first) {
              (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[ppVar5[0x1f].second - uVar11] = uVar20;
              operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            break;
          }
          (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar5[0x1f].second - uVar11] = uVar20;
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar17) {
            if (uVar17 == local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
              (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start
              [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar11] =
                   uVar20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            break;
          }
          (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar11] = uVar20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_150.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar28];
      local_150.second = uVar20;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_150);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_150.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar20;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar28 = uVar28 + 1;
      puVar18 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar28 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar18 >> 3
                             ));
  }
  ppVar13 = local_190;
  ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_118 != local_190) {
    lVar26 = (long)local_118 - (long)local_190;
    lVar27 = 0;
    do {
      if (ppVar14 == local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      ppVar5 = local_e0.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (long)ppVar13 + lVar27;
      uVar20 = local_e0.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)ppVar13 + lVar27].second;
      ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      do {
        uVar28 = ppVar5->first;
        if (ppVar14 == local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar6 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          if (ppVar6[0x1f].first <= uVar28) {
            if (uVar28 == ppVar6[0x1f].first) {
              (local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start[ppVar6[0x1f].second - uVar11] = uVar20;
              operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            break;
          }
          (local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar6[0x1f].second - uVar11] = uVar20;
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar14[-1].first <= uVar28) {
            if (uVar28 == ppVar14[-1].first) {
              (local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start[ppVar14[-1].second - uVar11] = uVar20;
              ppVar14 = ppVar14 + -1;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
            }
            break;
          }
          (local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar14[-1].second - uVar11] = uVar20;
          ppVar14 = ppVar14 + -1;
        }
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
      } while (ppVar14 != ppVar12);
      lVar27 = lVar27 + 1;
      pvVar30 = local_188;
    } while (lVar27 != lVar26 + (ulong)(lVar26 == 0));
  }
  if (ppVar14 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar18 = (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar14 == ppVar13) {
        ppVar13 = pppVar15[-1];
        pppVar15 = pppVar15 + -1;
        puVar18[ppVar13[0x1f].second - uVar11] = local_158;
        ppVar14 = ppVar13 + 0x20;
      }
      else {
        puVar18[ppVar14[-1].second - uVar11] = local_158;
      }
      ppVar14 = ppVar14 + -1;
    } while (ppVar14 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_180,&local_e0);
  if (local_e0.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1e8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}